

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O2

string * __thiscall
t_st_generator::map_writer
          (string *__return_storage_ptr__,t_st_generator *this,t_map *tmap,string *fname)

{
  int *piVar1;
  t_type *ptVar2;
  ostream *poVar3;
  char *pcVar4;
  string val;
  string key;
  ostringstream out;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  ostream local_1a0;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  temp_name_abi_cxx11_(&local_240,this);
  temp_name_abi_cxx11_(&local_260,this);
  pcVar4 = "[oprot writeMapBegin: (TMap new keyType: ";
  poVar3 = std::operator<<(&local_1a0,"[oprot writeMapBegin: (TMap new keyType: ");
  type_to_enum_abi_cxx11_(&local_2a0,(t_st_generator *)pcVar4,tmap->key_type_);
  poVar3 = std::operator<<(poVar3,(string *)&local_2a0);
  pcVar4 = "; valueType: ";
  poVar3 = std::operator<<(poVar3,"; valueType: ");
  type_to_enum_abi_cxx11_(&local_280,(t_st_generator *)pcVar4,tmap->val_type_);
  poVar3 = std::operator<<(poVar3,(string *)&local_280);
  poVar3 = std::operator<<(poVar3,"; size: ");
  poVar3 = std::operator<<(poVar3,(string *)fname);
  poVar3 = std::operator<<(poVar3," size).");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
  poVar3 = std::operator<<(&local_1a0,(string *)&local_2a0);
  poVar3 = std::operator<<(poVar3,(string *)fname);
  poVar3 = std::operator<<(poVar3," keysAndValuesDo: [:");
  poVar3 = std::operator<<(poVar3,(string *)&local_240);
  poVar3 = std::operator<<(poVar3," :");
  poVar3 = std::operator<<(poVar3,(string *)&local_260);
  poVar3 = std::operator<<(poVar3," |");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2a0);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
  poVar3 = std::operator<<(&local_1a0,(string *)&local_2a0);
  ptVar2 = tmap->key_type_;
  std::__cxx11::string::string((string *)&local_1c0,(string *)&local_240);
  write_val(&local_280,this,ptVar2,&local_1c0);
  poVar3 = std::operator<<(poVar3,(string *)&local_280);
  poVar3 = std::operator<<(poVar3,".");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1e0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_1e0);
  ptVar2 = tmap->val_type_;
  std::__cxx11::string::string((string *)&local_220,(string *)&local_260);
  write_val(&local_200,this,ptVar2,&local_220);
  std::operator<<(poVar3,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_2a0);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = std::operator<<(&local_1a0,"].");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_2a0);
  std::operator<<(poVar3,"oprot writeMapEnd] value");
  std::__cxx11::string::~string((string *)&local_2a0);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::map_writer(t_map* tmap, string fname) {
  std::ostringstream out;
  string key = temp_name();
  string val = temp_name();

  out << "[oprot writeMapBegin: (TMap new keyType: " << type_to_enum(tmap->get_key_type())
      << "; valueType: " << type_to_enum(tmap->get_val_type()) << "; size: " << fname << " size)."
      << endl;
  indent_up();

  out << indent() << fname << " keysAndValuesDo: [:" << key << " :" << val << " |" << endl;
  indent_up();

  out << indent() << write_val(tmap->get_key_type(), key) << "." << endl << indent()
      << write_val(tmap->get_val_type(), val);
  indent_down();

  out << "]." << endl << indent() << "oprot writeMapEnd] value";
  indent_down();

  return out.str();
}